

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::enumNBestAsString(LatticeImpl *this,size_t N)

{
  StringBuffer *os;
  char *pcVar1;
  
  os = stream(this);
  pcVar1 = enumNBestAsStringInternal(this,N,os);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::enumNBestAsString(size_t N) {
  return enumNBestAsStringInternal(N, stream());
}